

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_avx512bw_blend_popcnt(uint16_t *data,uint32_t len,uint32_t *flags)

{
  ulong uVar1;
  int *piVar2;
  ushort uVar3;
  long lVar4;
  ulong uVar5;
  int j;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  
  auVar8 = vpbroadcastd_avx512f(ZEXT416(0xff00ff));
  auVar9 = vpbroadcastd_avx512f(ZEXT416(0xff00ff00));
  uVar5 = 0;
  while (uVar1 = uVar5 + 2, uVar1 <= len >> 5) {
    auVar10 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar5 * 0x20 + 0x20));
    auVar11 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar5 * 0x20));
    auVar12 = vpsllw_avx512bw(auVar10,8);
    auVar10 = vpsrlw_avx512bw(auVar10,8);
    auVar12 = vpternlogd_avx512f(auVar12,auVar11,auVar8,0xf8);
    auVar10 = vpternlogd_avx512f(auVar10,auVar11,auVar9,0xf8);
    for (lVar4 = 0x20; uVar5 = uVar1, lVar4 != 0; lVar4 = lVar4 + -4) {
      uVar6 = vpmovb2m_avx512bw(auVar12);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      uVar7 = vpmovb2m_avx512bw(auVar10);
      auVar10 = vpaddb_avx512bw(auVar10,auVar10);
      piVar2 = (int *)((long)flags + lVar4 + -4);
      *piVar2 = *piVar2 + (int)POPCOUNT(uVar6);
      piVar2 = (int *)((long)flags + lVar4 + 0x1c);
      *piVar2 = *piVar2 + (int)POPCOUNT(uVar7);
    }
  }
  for (uVar5 = uVar5 << 5; uVar5 < len; uVar5 = uVar5 + 1) {
    uVar3 = data[uVar5];
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      flags[lVar4] = flags[lVar4] + (uint)((uVar3 >> ((uint)lVar4 & 0x1f) & 1) != 0);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx512bw_blend_popcnt(const uint16_t* data, uint32_t len, uint32_t* flags) { 
    const __m512i* data_vectors = (const __m512i*)(data);
    const uint32_t n_cycles = len / 32;

    size_t i = 0;
    for (/**/; i + 2 <= n_cycles; i += 2) {
        __m512i v0 = _mm512_loadu_si512(data_vectors + i + 0);
        __m512i v1 = _mm512_loadu_si512(data_vectors + i + 1);

        __m512i input0 = _mm512_ternarylogic_epi32(v0, _mm512_set1_epi16(0x00FF), _mm512_slli_epi16(v1, 8), AND_OR);
        __m512i input1 = _mm512_ternarylogic_epi32(v0, _mm512_set1_epi16(0xFF00), _mm512_srli_epi16(v1, 8), AND_OR);
        
        for (int i = 0; i < 8; ++i) {
            flags[ 7 - i] += _mm_popcnt_u64(_mm512_movepi8_mask(input0));
            flags[15 - i] += _mm_popcnt_u64(_mm512_movepi8_mask(input1));
            input0 = _mm512_add_epi8(input0, input0);
            input1 = _mm512_add_epi8(input1, input1);
        }
    }

    i *= 32;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((data[i] & (1 << j)) >> j);
        }
    }

    return 0;
}